

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::MapEntryMessageComparator::operator()
          (MapEntryMessageComparator *this,Message *a,Message *b)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  bool bVar3;
  int32 iVar4;
  int32 iVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint uVar8;
  LogMessage *other;
  int64 iVar9;
  int64 iVar10;
  uint64 uVar11;
  uint64 uVar12;
  Reflection *this_00;
  char *__n;
  ulong uVar13;
  string second;
  string first;
  undefined1 local_88 [32];
  undefined1 local_68 [56];
  
  (*(a->super_MessageLite)._vptr_MessageLite[0x15])(a);
  pFVar1 = this->field_;
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_88._0_8_ = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
               (FieldDescriptor **)local_88);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar1 + 0x38) * 4))
  {
  case 1:
    iVar4 = Reflection::GetInt32(this_00,a,this->field_);
    iVar5 = Reflection::GetInt32(this_00,b,this->field_);
    bVar2 = SBORROW4(iVar4,iVar5);
    bVar3 = iVar4 - iVar5 < 0;
    goto LAB_002ac0a2;
  case 2:
    iVar9 = Reflection::GetInt64(this_00,a,this->field_);
    iVar10 = Reflection::GetInt64(this_00,b,this->field_);
    bVar2 = SBORROW8(iVar9,iVar10);
    bVar3 = iVar9 - iVar10 < 0;
LAB_002ac0a2:
    bVar3 = bVar2 != bVar3;
    break;
  case 3:
    uVar6 = Reflection::GetUInt32(this_00,a,this->field_);
    uVar7 = Reflection::GetUInt32(this_00,b,this->field_);
    bVar3 = uVar6 < uVar7;
    break;
  case 4:
    uVar11 = Reflection::GetUInt64(this_00,a,this->field_);
    uVar12 = Reflection::GetUInt64(this_00,b,this->field_);
    bVar3 = uVar11 < uVar12;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x80f);
    other = internal::LogMessage::operator<<((LogMessage *)local_68,"Invalid key for map field.");
    internal::LogFinisher::operator=((LogFinisher *)local_88,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    bVar3 = true;
    break;
  case 7:
    bVar2 = Reflection::GetBool(this_00,a,this->field_);
    bVar3 = Reflection::GetBool(this_00,b,this->field_);
    bVar3 = !bVar2 && bVar3;
    break;
  case 9:
    Reflection::GetString_abi_cxx11_((string *)local_68,this_00,a,this->field_);
    Reflection::GetString_abi_cxx11_((string *)local_88,this_00,b,this->field_);
    __n = (char *)local_68._8_8_;
    if ((ulong)local_88._8_8_ < (ulong)local_68._8_8_) {
      __n = (char *)local_88._8_8_;
    }
    if (__n == (char *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar8 = memcmp((void *)local_68._0_8_,(void *)local_88._0_8_,(size_t)__n);
      uVar13 = (ulong)uVar8;
    }
    if ((int)uVar13 == 0) {
      uVar13 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_68._8_8_ - local_88._8_8_)) {
        uVar13 = local_68._8_8_ - local_88._8_8_;
      }
      if (0x7ffffffe < (long)uVar13) {
        uVar13 = 0;
      }
    }
    if ((FieldDescriptor *)local_88._0_8_ != (FieldDescriptor *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    bVar3 = (bool)((byte)(uVar13 >> 0x1f) & 1);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  return bVar3;
}

Assistant:

bool operator()(const Message* a, const Message* b) {
    const Reflection* reflection = a->GetReflection();
    switch (field_->cpp_type()) {
      case FieldDescriptor::CPPTYPE_BOOL: {
        bool first = reflection->GetBool(*a, field_);
        bool second = reflection->GetBool(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT32: {
        int32 first = reflection->GetInt32(*a, field_);
        int32 second = reflection->GetInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        int64 first = reflection->GetInt64(*a, field_);
        int64 second = reflection->GetInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        uint32 first = reflection->GetUInt32(*a, field_);
        uint32 second = reflection->GetUInt32(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 first = reflection->GetUInt64(*a, field_);
        uint64 second = reflection->GetUInt64(*b, field_);
        return first < second;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        std::string first = reflection->GetString(*a, field_);
        std::string second = reflection->GetString(*b, field_);
        return first < second;
      }
      default:
        GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
        return true;
    }
  }